

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

void __thiscall helics::InputInfo::setProperty(InputInfo *this,int32_t option,int32_t value)

{
  int in_EDX;
  int in_ESI;
  long in_RDI;
  bool bVar1;
  bool bvalue;
  undefined4 in_stack_ffffffffffffffd8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = in_EDX != 0;
  if (in_ESI == 0x18d) {
    *(bool *)(in_RDI + 0x68) = bVar1;
  }
  else if (in_ESI == 0x192) {
    *(byte *)(in_RDI + 0x68) = (bVar1 ^ 0xffU) & 1;
  }
  else if (in_ESI == 0x197) {
    *(uint *)(in_RDI + 0x70) = (uint)bVar1;
  }
  else if (in_ESI == 0x199) {
    *(uint *)(in_RDI + 0x70) = (uint)!bVar1;
  }
  else if (in_ESI == 0x19e) {
    *(bool *)(in_RDI + 0x6d) = bVar1;
  }
  else if (in_ESI == 0x1bf) {
    *(bool *)(in_RDI + 0x6e) = bVar1;
  }
  else if (in_ESI == 0x1c6) {
    *(bool *)(in_RDI + 0x6b) = bVar1;
  }
  else if (in_ESI == 0x1db) {
    *(bool *)(in_RDI + 0x6c) = bVar1;
  }
  else if (in_ESI == 0x1fe) {
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffffe0,
               (value_type_conflict1 *)CONCAT44(0x1fe,in_stack_ffffffffffffffd8));
  }
  else if (in_ESI == 0x200) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x5ca3fd);
  }
  else if (in_ESI == 0x20a) {
    *(int *)(in_RDI + 0x70) = in_EDX;
  }
  else if (in_ESI == 0x22d) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffe0,
               CONCAT44(0x22d,in_stack_ffffffffffffffd8),(time_units)((ulong)in_RDI >> 0x20));
    *(vector<int,_std::allocator<int>_> **)(in_RDI + 0x78) = in_stack_ffffffffffffffe0;
  }
  return;
}

Assistant:

void InputInfo::setProperty(int32_t option, int32_t value)
{
    bool bvalue = (value != 0);
    switch (option) {
        case defs::Options::IGNORE_INTERRUPTS:
            not_interruptible = bvalue;
            break;
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            only_update_on_change = bvalue;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            required = bvalue;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            required = !bvalue;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            required_connnections = bvalue ? 1 : 0;
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            required_connnections = bvalue ? 0 : 1;
            break;
        case defs::Options::STRICT_TYPE_CHECKING:
            strict_type_matching = bvalue;
            break;
        case defs::Options::IGNORE_UNIT_MISMATCH:
            ignore_unit_mismatch = bvalue;
            break;
        case defs::Options::CONNECTIONS:
            required_connnections = value;
            break;
        case defs::Options::INPUT_PRIORITY_LOCATION:
            priority_sources.push_back(value);
            break;
        case defs::Options::CLEAR_PRIORITY_LIST:
            priority_sources.clear();
            break;
        case defs::Options::TIME_RESTRICTED:
            minTimeGap = Time(value, time_units::ms);
            break;
        default:
            break;
    }
}